

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O3

void __thiscall Assimp::ColladaParser::ReadIndexData(ColladaParser *this,Mesh *pMesh)

{
  byte *pbVar1;
  _func_int *p_Var2;
  _func_int **pp_Var3;
  bool bVar4;
  bool bVar5;
  size_type sVar6;
  bool bVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  char *pcVar12;
  byte *pbVar13;
  ulong uVar14;
  size_t sVar15;
  undefined4 extraout_var_12;
  ostream *poVar16;
  char *pElement;
  ulong __n;
  ulong uVar17;
  vector<unsigned_long,_std::allocator<unsigned_long>_> vcount;
  vector<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_> perIndexData
  ;
  string elementName;
  SubMesh subgroup;
  PrimitiveType local_280;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_268;
  ulong local_248;
  Mesh *local_240;
  vector<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_> local_238;
  char *local_218;
  long local_210;
  char local_208 [16];
  value_type local_1f8;
  string local_1d0;
  char *local_1b0;
  string local_1a8 [11];
  undefined4 extraout_var_11;
  
  local_268.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_268.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
  local_268.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
  local_238.
  super__Vector_base<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_238.
  super__Vector_base<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_238.
  super__Vector_base<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_240 = pMesh;
  uVar8 = GetAttribute(this,"count");
  iVar9 = (*this->mReader->_vptr_IIrrXMLReader[10])(this->mReader,(ulong)uVar8);
  iVar10 = TestAttribute(this,"material");
  local_1f8.mMaterial._M_dataplus._M_p = (pointer)&local_1f8.mMaterial.field_2;
  local_1f8.mMaterial._M_string_length = 0;
  local_1f8.mMaterial.field_2._M_local_buf[0] = '\0';
  if (-1 < iVar10) {
    iVar10 = (*this->mReader->_vptr_IIrrXMLReader[6])();
    sVar6 = local_1f8.mMaterial._M_string_length;
    strlen((char *)CONCAT44(extraout_var,iVar10));
    std::__cxx11::string::_M_replace
              ((ulong)&local_1f8,0,(char *)sVar6,CONCAT44(extraout_var,iVar10));
  }
  iVar10 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
  std::__cxx11::string::string
            ((string *)&local_218,(char *)CONCAT44(extraout_var_00,iVar10),(allocator *)local_1a8);
  iVar10 = (*this->mReader->_vptr_IIrrXMLReader[3])();
  if (iVar10 != 1) {
LAB_003f8947:
    __assert_fail("mReader->getNodeType() == irr::io::EXN_ELEMENT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Collada/ColladaParser.h"
                  ,0x178,"bool Assimp::ColladaParser::IsElement(const char *) const");
  }
  iVar10 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
  iVar10 = strcmp((char *)CONCAT44(extraout_var_01,iVar10),"lines");
  if (iVar10 == 0) {
    local_280 = Prim_Lines;
    goto LAB_003f85da;
  }
  iVar11 = (*this->mReader->_vptr_IIrrXMLReader[3])();
  if (iVar11 != 1) goto LAB_003f8947;
  iVar11 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
  iVar11 = strcmp((char *)CONCAT44(extraout_var_02,iVar11),"linestrips");
  if (iVar11 == 0) {
    local_280 = Prim_LineStrip;
    bVar7 = true;
    bVar4 = false;
    bVar5 = false;
    goto LAB_003f85f2;
  }
  iVar11 = (*this->mReader->_vptr_IIrrXMLReader[3])();
  if (iVar11 != 1) goto LAB_003f8947;
  iVar11 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
  iVar11 = strcmp((char *)CONCAT44(extraout_var_03,iVar11),"polygons");
  if (iVar11 == 0) {
    local_280 = Prim_Polygon;
LAB_003f85da:
    bVar4 = false;
LAB_003f85e2:
    bVar5 = false;
  }
  else {
    iVar11 = (*this->mReader->_vptr_IIrrXMLReader[3])();
    if (iVar11 != 1) goto LAB_003f8947;
    iVar11 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
    iVar11 = strcmp((char *)CONCAT44(extraout_var_04,iVar11),"polylist");
    if (iVar11 == 0) {
      local_280 = Prim_Polylist;
      goto LAB_003f85da;
    }
    iVar11 = (*this->mReader->_vptr_IIrrXMLReader[3])();
    if (iVar11 != 1) goto LAB_003f8947;
    iVar11 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
    iVar11 = strcmp((char *)CONCAT44(extraout_var_05,iVar11),"triangles");
    if (iVar11 == 0) {
      local_280 = Prim_Triangles;
      goto LAB_003f85da;
    }
    iVar11 = (*this->mReader->_vptr_IIrrXMLReader[3])();
    if (iVar11 != 1) goto LAB_003f8947;
    iVar11 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
    iVar11 = strcmp((char *)CONCAT44(extraout_var_06,iVar11),"trifans");
    if (iVar11 == 0) {
      local_280 = Prim_TriFans;
      bVar4 = true;
      goto LAB_003f85e2;
    }
    bVar7 = IsElement(this,"tristrips");
    if (!bVar7) {
      __assert_fail("primType != Prim_Invalid",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Collada/ColladaParser.cpp"
                    ,0x934,"void Assimp::ColladaParser::ReadIndexData(Mesh *)");
    }
    local_280 = Prim_TriStrips;
    bVar5 = true;
    bVar4 = false;
  }
  bVar7 = false;
LAB_003f85f2:
  __n = (ulong)iVar9;
  local_248 = 0;
  do {
    while( true ) {
      iVar11 = (*this->mReader->_vptr_IIrrXMLReader[2])();
      if ((char)iVar11 == '\0') goto LAB_003f8899;
      iVar11 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      p_Var2 = this->mReader->_vptr_IIrrXMLReader[3];
      if (iVar11 != 1) break;
      iVar11 = (*p_Var2)();
      if (iVar11 != 1) goto LAB_003f8947;
      iVar11 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
      iVar11 = strcmp((char *)CONCAT44(extraout_var_07,iVar11),"input");
      if (iVar11 == 0) {
        ReadInputChannel(this,&local_238);
      }
      else {
        iVar11 = (*this->mReader->_vptr_IIrrXMLReader[3])();
        if (iVar11 != 1) goto LAB_003f8947;
        iVar11 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
        iVar11 = strcmp((char *)CONCAT44(extraout_var_08,iVar11),"vcount");
        pp_Var3 = this->mReader->_vptr_IIrrXMLReader;
        if (iVar11 == 0) {
          iVar11 = (*pp_Var3[0xf])();
          if ((char)iVar11 == '\0') {
            if (iVar9 != 0) {
              pbVar13 = (byte *)GetTextContent(this);
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve(&local_268,__n);
              uVar14 = (ulong)*pbVar13;
              uVar17 = 0;
              do {
                if ((char)uVar14 == '\0') {
                  local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_1a8,
                             "Expected more values while reading <vcount> contents.","");
                  ThrowException(this,local_1a8);
                }
                if ((byte)((char)uVar14 - 0x3aU) < 0xf6) {
                  local_1a8[0]._M_dataplus._M_p = (pointer)0x0;
                }
                else {
                  uVar8 = 0;
                  do {
                    uVar8 = (uint)(byte)((char)uVar14 - 0x30) + uVar8 * 10;
                    pbVar1 = pbVar13 + 1;
                    uVar14 = (ulong)*pbVar1;
                    pbVar13 = pbVar13 + 1;
                  } while (0xf5 < (byte)(*pbVar1 - 0x3a));
                  local_1a8[0]._M_dataplus._M_p = (pointer)(ulong)uVar8;
                }
                if (local_268.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_finish ==
                    local_268.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                  _M_realloc_insert<unsigned_long>
                            (&local_268,
                             (iterator)
                             local_268.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)local_1a8);
                }
                else {
                  *local_268.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish =
                       (unsigned_long)local_1a8[0]._M_dataplus._M_p;
                  local_268.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish =
                       local_268.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish + 1;
                }
                while ((uVar14 = (ulong)*pbVar13, uVar14 < 0x21 &&
                       ((0x100002600U >> (uVar14 & 0x3f) & 1) != 0))) {
                  pbVar13 = pbVar13 + 1;
                }
                uVar17 = (ulong)((int)uVar17 + 1);
              } while (uVar17 < __n);
            }
            TestClosing(this,"vcount");
          }
        }
        else {
          iVar11 = (*pp_Var3[3])();
          if (iVar11 != 1) goto LAB_003f8947;
          iVar11 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
          if ((*(char *)CONCAT44(extraout_var_09,iVar11) == 'p') &&
             (((char *)CONCAT44(extraout_var_09,iVar11))[1] == '\0')) {
            iVar11 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
            if ((char)iVar11 == '\0') {
              sVar15 = ReadPrimitives(this,local_240,&local_238,__n,&local_268,local_280);
              local_248 = local_248 + sVar15;
            }
          }
          else {
            iVar11 = (*this->mReader->_vptr_IIrrXMLReader[3])();
            if (iVar11 != 1) goto LAB_003f8947;
            iVar11 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
            iVar11 = strcmp((char *)CONCAT44(extraout_var_10,iVar11),"extra");
            pElement = "extra";
            if (iVar11 != 0) {
              iVar11 = (*this->mReader->_vptr_IIrrXMLReader[3])();
              if (iVar11 != 1) goto LAB_003f8947;
              iVar11 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
              pcVar12 = (char *)CONCAT44(extraout_var_11,iVar11);
              if (((*pcVar12 != 'p') || (pcVar12[1] != 'h')) ||
                 (pElement = "ph", pcVar12[2] != '\0')) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,"Unexpected sub element <",0x18);
                iVar9 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
                local_1b0 = (char *)CONCAT44(extraout_var_12,iVar9);
                poVar16 = (ostream *)
                          Formatter::
                          basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                          operator<<((basic_formatter<char,std::char_traits<char>,std::allocator<char>>
                                      *)local_1a8,&local_1b0);
                std::__ostream_insert<char,std::char_traits<char>>(poVar16,"> in tag <",10);
                std::__ostream_insert<char,std::char_traits<char>>(poVar16,local_218,local_210);
                std::__ostream_insert<char,std::char_traits<char>>(poVar16,">",1);
                std::__cxx11::stringbuf::str();
                ThrowException(this,&local_1d0);
              }
            }
            SkipElement(this,pElement);
          }
        }
      }
    }
    iVar11 = (*p_Var2)();
  } while (iVar11 != 2);
  (*this->mReader->_vptr_IIrrXMLReader[0xd])();
  iVar9 = std::__cxx11::string::compare((char *)&local_218);
  if (iVar9 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Expected end of <",0x11);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,local_218,local_210);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"> element.",10);
    std::__cxx11::stringbuf::str();
    ThrowException(this,&local_1d0);
  }
LAB_003f8899:
  if (((iVar10 != 0) && ((!bVar4 && !bVar5) && !bVar7)) && (local_248 != __n)) {
    __assert_fail("actualPrimitives == numPrimitives",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Collada/ColladaParser.cpp"
                  ,0x975,"void Assimp::ColladaParser::ReadIndexData(Mesh *)");
  }
  local_1f8.mNumFaces = local_248;
  std::vector<Assimp::Collada::SubMesh,_std::allocator<Assimp::Collada::SubMesh>_>::push_back
            (&local_240->mSubMeshes,&local_1f8);
  if (local_218 != local_208) {
    operator_delete(local_218);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.mMaterial._M_dataplus._M_p != &local_1f8.mMaterial.field_2) {
    operator_delete(local_1f8.mMaterial._M_dataplus._M_p);
  }
  std::vector<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>::
  ~vector(&local_238);
  if (local_268.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_268.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ColladaParser::ReadIndexData(Mesh* pMesh)
{
    std::vector<size_t> vcount;
    std::vector<InputChannel> perIndexData;

    // read primitive count from the attribute
    int attrCount = GetAttribute("count");
    size_t numPrimitives = (size_t)mReader->getAttributeValueAsInt(attrCount);
    // some mesh types (e.g. tristrips) don't specify primitive count upfront,
    // so we need to sum up the actual number of primitives while we read the <p>-tags
    size_t actualPrimitives = 0;

    // material subgroup
    int attrMaterial = TestAttribute("material");
    SubMesh subgroup;
    if (attrMaterial > -1)
        subgroup.mMaterial = mReader->getAttributeValue(attrMaterial);

    // distinguish between polys and triangles
    std::string elementName = mReader->getNodeName();
    PrimitiveType primType = Prim_Invalid;
    if (IsElement("lines"))
        primType = Prim_Lines;
    else if (IsElement("linestrips"))
        primType = Prim_LineStrip;
    else if (IsElement("polygons"))
        primType = Prim_Polygon;
    else if (IsElement("polylist"))
        primType = Prim_Polylist;
    else if (IsElement("triangles"))
        primType = Prim_Triangles;
    else if (IsElement("trifans"))
        primType = Prim_TriFans;
    else if (IsElement("tristrips"))
        primType = Prim_TriStrips;

    ai_assert(primType != Prim_Invalid);

    // also a number of <input> elements, but in addition a <p> primitive collection and probably index counts for all primitives
    while (mReader->read())
    {
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT)
        {
            if (IsElement("input"))
            {
                ReadInputChannel(perIndexData);
            }
            else if (IsElement("vcount"))
            {
                if (!mReader->isEmptyElement())
                {
                    if (numPrimitives)  // It is possible to define a mesh without any primitives
                    {
                        // case <polylist> - specifies the number of indices for each polygon
                        const char* content = GetTextContent();
                        vcount.reserve(numPrimitives);
                        for (unsigned int a = 0; a < numPrimitives; a++)
                        {
                            if (*content == 0)
                                ThrowException("Expected more values while reading <vcount> contents.");
                            // read a number
                            vcount.push_back((size_t)strtoul10(content, &content));
                            // skip whitespace after it
                            SkipSpacesAndLineEnd(&content);
                        }
                    }

                    TestClosing("vcount");
                }
            }
            else if (IsElement("p"))
            {
                if (!mReader->isEmptyElement())
                {
                    // now here the actual fun starts - these are the indices to construct the mesh data from
                    actualPrimitives += ReadPrimitives(pMesh, perIndexData, numPrimitives, vcount, primType);
                }
            }
            else if (IsElement("extra"))
            {
                SkipElement("extra");
            }
            else if (IsElement("ph")) {
                SkipElement("ph");
            }
            else {
                ThrowException(format() << "Unexpected sub element <" << mReader->getNodeName() << "> in tag <" << elementName << ">");
            }
        }
        else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END)
        {
            if (mReader->getNodeName() != elementName)
                ThrowException(format() << "Expected end of <" << elementName << "> element.");

            break;
        }
    }

#ifdef ASSIMP_BUILD_DEBUG
    if (primType != Prim_TriFans && primType != Prim_TriStrips && primType != Prim_LineStrip &&
        primType != Prim_Lines) { // this is ONLY to workaround a bug in SketchUp 15.3.331 where it writes the wrong 'count' when it writes out the 'lines'.
        ai_assert(actualPrimitives == numPrimitives);
    }
#endif

    // only when we're done reading all <p> tags (and thus know the final vertex count) can we commit the submesh
    subgroup.mNumFaces = actualPrimitives;
    pMesh->mSubMeshes.push_back(subgroup);
}